

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgIsDataAvail(uint aTime)

{
  uint uVar1;
  uint uVar2;
  
  if (((byte)ZvgIO.ecpFlags & 1) == 0) {
    uVar2 = 0x18;
  }
  else {
    uVar1 = waitForDsrNE('X','X',(ulong)aTime);
    if (uVar1 == 0xffffffff) {
      uVar2 = 0x15;
    }
    else {
      uVar2 = 0;
      if ((~uVar1 & 0x50) != 0) {
        compatibility();
        uVar2 = 0x19;
      }
    }
  }
  return uVar2;
}

Assistant:

uint zvgIsDataAvail( uint aTime)
{
	uint	dsr;

	// must be in ECP mode

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
		return (errEcpBadMode);

	// wait for nPeriphRequest to go low

	dsr = waitForDsrNE( DSR_PeriphClk|DSR_nPeriphRequest|DSR_XFlag,
			DSR_PeriphClk|DSR_nPeriphRequest|DSR_XFlag, aTime);

	if (dsr == ZVG_TIMEOUT)
		return (errEcpTimeout);		// nothing wrong, just no data available

	// check for a breach in the ECP protocol

	else if ((dsr & (DSR_XFlag|DSR_PeriphClk)) != (DSR_XFlag | DSR_PeriphClk))
	{	compatibility();				// if status incorrect, return to compatability mode
		return (errEcpToSpp);		// indicate no longer in ECP mode
	}
	return (errOk);
}